

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzePostModify(ExpressionContext *ctx,SynPostModify *syntax)

{
  VariableData *pVVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ExprGetAddress *expr;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  ExprGetAddress *pEVar6;
  ExprBase *pEVar7;
  TypeBase *pTVar8;
  undefined4 extraout_var_02;
  TypeBase *pTVar9;
  ExprError *pEVar10;
  undefined1 uVar11;
  char *pcVar12;
  ExprGetAddress *pEVar13;
  VariableHandle *variable;
  undefined4 extraout_var_01;
  
  expr = (ExprGetAddress *)AnalyzeExpression(ctx,syntax->value);
  pTVar9 = (expr->super_ExprBase).type;
  if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0)) {
    if ((expr == (ExprGetAddress *)0x0) || (pEVar6 = expr, (expr->super_ExprBase).typeID != 0x22)) {
      pEVar6 = (ExprGetAddress *)0x0;
    }
    if (pEVar6 == (ExprGetAddress *)0x0) {
      if ((expr == (ExprGetAddress *)0x0) || (pEVar6 = expr, (expr->super_ExprBase).typeID != 0x16))
      {
        pEVar6 = (ExprGetAddress *)0x0;
      }
      pEVar13 = expr;
      if (pEVar6 != (ExprGetAddress *)0x0) {
        pEVar13 = (ExprGetAddress *)pEVar6->variable;
      }
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      type = ExpressionContext::GetReferenceType(ctx,(expr->super_ExprBase).type);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar5);
      pVVar1 = (VariableData *)pEVar6->variable;
      variable->source = (pEVar6->super_ExprBase).source;
      variable->variable = pVVar1;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var,iVar4),&syntax->super_SynBase,
                 &type->super_TypeBase,variable);
      pEVar13 = (ExprGetAddress *)CONCAT44(extraout_var,iVar4);
    }
    AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)expr);
    pTVar9 = (pEVar13->super_ExprBase).type;
    if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0x12)) {
      pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pTVar9 = (expr->super_ExprBase).type;
      pEVar10 = anon_unknown.dwarf_11255e::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar8,
                           "ERROR: cannot change immutable value of type %.*s",
                           (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin));
      return &pEVar10->super_ExprBase;
    }
    bVar3 = ExpressionContext::IsNumericType(ctx,(expr->super_ExprBase).type);
    if (!bVar3) {
      pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pcVar12 = "decrement";
      if (syntax->isIncrement != false) {
        pcVar12 = "increment";
      }
      pTVar8 = (expr->super_ExprBase).type;
      pcVar2 = (pTVar8->name).begin;
      pEVar10 = anon_unknown.dwarf_11255e::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar9,
                           "ERROR: %s is not supported on \'%.*s\'",pcVar12,
                           (ulong)(uint)(*(int *)&(pTVar8->name).end - (int)pcVar2),pcVar2);
      return &pEVar10->super_ExprBase;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar9 = (expr->super_ExprBase).type;
    uVar11 = syntax->isIncrement;
    pEVar7->typeID = 0x11;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f67f8;
    pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar13;
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    uVar11 = syntax->isIncrement;
    pEVar7->typeID = 0x10;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f67c0;
    pEVar7[1]._vptr_ExprBase = (_func_int **)expr;
  }
  *(undefined1 *)&pEVar7[1].typeID = uVar11;
  return pEVar7;
}

Assistant:

ExprBase* AnalyzePostModify(ExpressionContext &ctx, SynPostModify *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, ctx.GetErrorType(), value, syntax->isIncrement);

	ExprBase* wrapped = value;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(syntax, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	else if(ExprDereference *node = getType<ExprDereference>(value))
		wrapped = node->value;

	AssertValueExpression(ctx, syntax, value);

	if(!isType<TypeRef>(wrapped->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(value->type->name));

	if(!ctx.IsNumericType(value->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: %s is not supported on '%.*s'", (syntax->isIncrement ? "increment" : "decrement"), FMT_ISTR(value->type->name));

	return new (ctx.get<ExprPostModify>()) ExprPostModify(syntax, value->type, wrapped, syntax->isIncrement);
}